

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_unicode.c
# Opt level: O2

PHYSFS_uint32 utf16codepoint(PHYSFS_uint16 **_str)

{
  ushort uVar1;
  ushort uVar2;
  ushort *puVar3;
  PHYSFS_uint32 PVar4;
  ushort *puVar5;
  uint uVar6;
  
  puVar3 = *_str;
  uVar1 = *puVar3;
  if (uVar1 == 0) {
    return 0;
  }
  puVar5 = puVar3 + 1;
  uVar6 = uVar1 & 0xfc00;
  PVar4 = 0x3f;
  if ((((short)uVar6 != -0x2400) && (PVar4 = (uint)uVar1, uVar6 == 0xd800)) &&
     (uVar2 = *puVar5, PVar4 = 0x3f, 0xfbff < (ushort)(uVar2 + 0x2000))) {
    puVar5 = puVar3 + 2;
    PVar4 = (uint)uVar1 * 0x400 + (uint)uVar2 + 0xfc9f2400;
  }
  *_str = puVar5;
  return PVar4;
}

Assistant:

static PHYSFS_uint32 utf16codepoint(const PHYSFS_uint16 **_str)
{
    const PHYSFS_uint16 *src = *_str;
    PHYSFS_uint32 cp = (PHYSFS_uint32) *(src++);

    if (cp == 0)  /* null terminator, end of string. */
        return 0;
    /* Orphaned second half of surrogate pair? */
    else if ((cp >= 0xDC00) && (cp <= 0xDFFF))
        cp = UNICODE_BOGUS_CHAR_CODEPOINT;
    else if ((cp >= 0xD800) && (cp <= 0xDBFF))  /* start surrogate pair! */
    {
        const PHYSFS_uint32 pair = (PHYSFS_uint32) *src;
        if (pair == 0)
            cp = UNICODE_BOGUS_CHAR_CODEPOINT;
        else if ((pair < 0xDC00) || (pair > 0xDFFF))
            cp = UNICODE_BOGUS_CHAR_CODEPOINT;
        else
        {
            src++;  /* eat the other surrogate. */
            cp = (((cp - 0xD800) << 10) | (pair - 0xDC00));
        } /* else */
    } /* else if */

    *_str = src;
    return cp;
}